

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_2,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,3,2>
          (Matrix<float,_2,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_2> *a,
          Vector<float,_3> *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Matrix<float,_3,_2> *extraout_RDX;
  Matrix<float,_3,_2> *mat;
  Matrix<float,_3,_2> *extraout_RDX_00;
  int local_40;
  int local_3c;
  int c;
  int r;
  Matrix<float,_3,_2> retVal;
  Vector<float,_3> *b_local;
  Vector<float,_2> *a_local;
  
  retVal.m_data.m_data[1].m_data._4_8_ = a;
  tcu::Matrix<float,_3,_2>::Matrix((Matrix<float,_3,_2> *)&c);
  mat = extraout_RDX;
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
      pfVar3 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)this,local_40);
      fVar1 = *pfVar3;
      pfVar3 = tcu::Vector<float,_3>::operator[]
                         ((Vector<float,_3> *)retVal.m_data.m_data[1].m_data._4_8_,local_3c);
      fVar2 = *pfVar3;
      pfVar3 = tcu::Matrix<float,_3,_2>::operator()((Matrix<float,_3,_2> *)&c,local_3c,local_40);
      *pfVar3 = fVar1 * fVar2;
      mat = extraout_RDX_00;
    }
  }
  tcu::transpose<float,3,2>(__return_storage_ptr__,(tcu *)&c,mat);
  tcu::Matrix<float,_3,_2>::~Matrix((Matrix<float,_3,_2> *)&c);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}